

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::avx::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::avx::ArrayIntersectorK_1<4,_embree::avx::TriangleMIntersectorKMoeller<4,_4,_false>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float *pfVar1;
  undefined4 uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  int iVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  bool bVar10;
  ulong uVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  undefined1 auVar48 [16];
  uint uVar49;
  ulong unaff_RBP;
  size_t mask;
  undefined4 uVar50;
  undefined4 uVar52;
  ulong uVar51;
  ulong uVar53;
  ulong uVar54;
  ulong uVar55;
  ulong uVar56;
  ulong *puVar57;
  ulong *puVar58;
  long lVar59;
  ulong uVar60;
  ulong uVar61;
  bool bVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  uint uVar72;
  uint uVar73;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  uint uVar74;
  undefined1 auVar71 [16];
  vint4 bi;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  vint4 ai;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  float fVar86;
  float fVar91;
  float fVar92;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  float fVar93;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  NodeRef stack [244];
  undefined1 local_928 [8];
  float fStack_920;
  float fStack_91c;
  undefined1 local_8f8 [8];
  float fStack_8f0;
  float fStack_8ec;
  float local_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  undefined1 local_888 [16];
  size_t local_7d8;
  ulong local_7d0 [244];
  
  local_7d8 = root.ptr;
  uVar2 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  auVar63._4_4_ = uVar2;
  auVar63._0_4_ = uVar2;
  auVar63._8_4_ = uVar2;
  auVar63._12_4_ = uVar2;
  uVar2 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  auVar64._4_4_ = uVar2;
  auVar64._0_4_ = uVar2;
  auVar64._8_4_ = uVar2;
  auVar64._12_4_ = uVar2;
  uVar2 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  auVar65._4_4_ = uVar2;
  auVar65._0_4_ = uVar2;
  auVar65._8_4_ = uVar2;
  auVar65._12_4_ = uVar2;
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar4 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar5 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  uVar55 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar53 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar54 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar6 = (tray->tnear).field_0.i[k];
  auVar100._4_4_ = iVar6;
  auVar100._0_4_ = iVar6;
  auVar100._8_4_ = iVar6;
  auVar100._12_4_ = iVar6;
  iVar6 = (tray->tfar).field_0.i[k];
  auVar67._4_4_ = iVar6;
  auVar67._0_4_ = iVar6;
  auVar67._8_4_ = iVar6;
  auVar67._12_4_ = iVar6;
  puVar58 = local_7d0;
  do {
    puVar57 = puVar58;
    if (puVar57 == &local_7d8) break;
    puVar58 = puVar57 + -1;
    uVar61 = puVar57[-1];
    do {
      if ((uVar61 & 8) == 0) {
        auVar77 = vsubps_avx(*(undefined1 (*) [16])(uVar61 + 0x20 + uVar55),auVar63);
        auVar68._0_4_ = auVar77._0_4_ * fVar3;
        auVar68._4_4_ = auVar77._4_4_ * fVar3;
        auVar68._8_4_ = auVar77._8_4_ * fVar3;
        auVar68._12_4_ = auVar77._12_4_ * fVar3;
        auVar77 = vsubps_avx(*(undefined1 (*) [16])(uVar61 + 0x20 + uVar53),auVar64);
        auVar75._0_4_ = auVar77._0_4_ * fVar4;
        auVar75._4_4_ = auVar77._4_4_ * fVar4;
        auVar75._8_4_ = auVar77._8_4_ * fVar4;
        auVar75._12_4_ = auVar77._12_4_ * fVar4;
        auVar77 = vpmaxsd_avx(auVar68,auVar75);
        auVar68 = vsubps_avx(*(undefined1 (*) [16])(uVar61 + 0x20 + uVar54),auVar65);
        auVar66._0_4_ = auVar68._0_4_ * fVar5;
        auVar66._4_4_ = auVar68._4_4_ * fVar5;
        auVar66._8_4_ = auVar68._8_4_ * fVar5;
        auVar66._12_4_ = auVar68._12_4_ * fVar5;
        auVar68 = vpmaxsd_avx(auVar66,auVar100);
        auVar77 = vpmaxsd_avx(auVar77,auVar68);
        auVar68 = vsubps_avx(*(undefined1 (*) [16])(uVar61 + 0x20 + (uVar55 ^ 0x10)),auVar63);
        auVar76._0_4_ = auVar68._0_4_ * fVar3;
        auVar76._4_4_ = auVar68._4_4_ * fVar3;
        auVar76._8_4_ = auVar68._8_4_ * fVar3;
        auVar76._12_4_ = auVar68._12_4_ * fVar3;
        auVar68 = vsubps_avx(*(undefined1 (*) [16])(uVar61 + 0x20 + (uVar53 ^ 0x10)),auVar64);
        auVar78._0_4_ = auVar68._0_4_ * fVar4;
        auVar78._4_4_ = auVar68._4_4_ * fVar4;
        auVar78._8_4_ = auVar68._8_4_ * fVar4;
        auVar78._12_4_ = auVar68._12_4_ * fVar4;
        auVar68 = vpminsd_avx(auVar76,auVar78);
        auVar75 = vsubps_avx(*(undefined1 (*) [16])(uVar61 + 0x20 + (uVar54 ^ 0x10)),auVar65);
        auVar79._0_4_ = auVar75._0_4_ * fVar5;
        auVar79._4_4_ = auVar75._4_4_ * fVar5;
        auVar79._8_4_ = auVar75._8_4_ * fVar5;
        auVar79._12_4_ = auVar75._12_4_ * fVar5;
        auVar75 = vpminsd_avx(auVar79,auVar67);
        auVar68 = vpminsd_avx(auVar68,auVar75);
        auVar77 = vpcmpgtd_avx(auVar77,auVar68);
        uVar49 = vmovmskps_avx(auVar77);
        unaff_RBP = ((ulong)uVar49 ^ 0xf) & 0xff;
      }
      if ((uVar61 & 8) == 0) {
        if (unaff_RBP == 0) {
          uVar49 = 4;
        }
        else {
          uVar60 = uVar61 & 0xfffffffffffffff0;
          lVar59 = 0;
          if (unaff_RBP != 0) {
            for (; (unaff_RBP >> lVar59 & 1) == 0; lVar59 = lVar59 + 1) {
            }
          }
          uVar49 = 0;
          uVar61 = *(ulong *)(uVar60 + lVar59 * 8);
          uVar56 = unaff_RBP - 1 & unaff_RBP;
          if (uVar56 != 0) {
            *puVar58 = uVar61;
            lVar59 = 0;
            if (uVar56 != 0) {
              for (; (uVar56 >> lVar59 & 1) == 0; lVar59 = lVar59 + 1) {
              }
            }
            uVar51 = uVar56 - 1;
            while( true ) {
              puVar58 = puVar58 + 1;
              uVar61 = *(ulong *)(uVar60 + lVar59 * 8);
              uVar51 = uVar51 & uVar56;
              if (uVar51 == 0) break;
              *puVar58 = uVar61;
              lVar59 = 0;
              if (uVar51 != 0) {
                for (; (uVar51 >> lVar59 & 1) == 0; lVar59 = lVar59 + 1) {
                }
              }
              uVar56 = uVar51 - 1;
            }
          }
        }
      }
      else {
        uVar49 = 6;
      }
    } while (uVar49 == 0);
    if (uVar49 == 6) {
      uVar60 = (ulong)((uint)uVar61 & 0xf) - 8;
      bVar62 = uVar60 != 0;
      if (bVar62) {
        uVar61 = uVar61 & 0xfffffffffffffff0;
        uVar2 = *(undefined4 *)(ray + k * 4);
        uVar52 = *(undefined4 *)(ray + k * 4 + 0x10);
        auVar77._4_4_ = uVar52;
        auVar77._0_4_ = uVar52;
        auVar77._8_4_ = uVar52;
        auVar77._12_4_ = uVar52;
        uVar52 = *(undefined4 *)(ray + k * 4 + 0x20);
        auVar87._4_4_ = uVar52;
        auVar87._0_4_ = uVar52;
        auVar87._8_4_ = uVar52;
        auVar87._12_4_ = uVar52;
        fVar7 = *(float *)(ray + k * 4 + 0x40);
        fVar8 = *(float *)(ray + k * 4 + 0x50);
        fVar9 = *(float *)(ray + k * 4 + 0x60);
        uVar56 = 0;
        do {
          lVar59 = uVar56 * 0xb0;
          pfVar1 = (float *)(uVar61 + 0x80 + lVar59);
          fVar24 = *pfVar1;
          fVar25 = pfVar1[1];
          fVar26 = pfVar1[2];
          fVar27 = pfVar1[3];
          pfVar1 = (float *)(uVar61 + 0x40 + lVar59);
          fVar28 = *pfVar1;
          fVar29 = pfVar1[1];
          fVar30 = pfVar1[2];
          fVar31 = pfVar1[3];
          auVar80._0_4_ = fVar28 * fVar24;
          auVar80._4_4_ = fVar29 * fVar25;
          auVar80._8_4_ = fVar30 * fVar26;
          auVar80._12_4_ = fVar31 * fVar27;
          pfVar1 = (float *)(uVar61 + 0x70 + lVar59);
          fVar32 = *pfVar1;
          fVar33 = pfVar1[1];
          fVar34 = pfVar1[2];
          fVar35 = pfVar1[3];
          pfVar1 = (float *)(uVar61 + 0x50 + lVar59);
          fVar36 = *pfVar1;
          fVar37 = pfVar1[1];
          fVar38 = pfVar1[2];
          fVar39 = pfVar1[3];
          auVar88._0_4_ = fVar32 * fVar36;
          auVar88._4_4_ = fVar33 * fVar37;
          auVar88._8_4_ = fVar34 * fVar38;
          auVar88._12_4_ = fVar35 * fVar39;
          auVar68 = vsubps_avx(auVar88,auVar80);
          pfVar1 = (float *)(uVar61 + 0x60 + lVar59);
          fVar40 = *pfVar1;
          fVar41 = pfVar1[1];
          fVar42 = pfVar1[2];
          fVar43 = pfVar1[3];
          local_928._4_4_ = fVar41 * fVar37;
          local_928._0_4_ = fVar40 * fVar36;
          fStack_920 = fVar42 * fVar38;
          fStack_91c = fVar43 * fVar39;
          auVar48._4_4_ = uVar2;
          auVar48._0_4_ = uVar2;
          auVar48._8_4_ = uVar2;
          auVar48._12_4_ = uVar2;
          auVar75 = vsubps_avx(*(undefined1 (*) [16])(uVar61 + lVar59),auVar48);
          auVar66 = vsubps_avx(*(undefined1 (*) [16])(uVar61 + 0x10 + lVar59),auVar77);
          auVar76 = vsubps_avx(*(undefined1 (*) [16])(uVar61 + 0x20 + lVar59),auVar87);
          pfVar1 = (float *)(uVar61 + 0x30 + lVar59);
          fVar44 = *pfVar1;
          fVar45 = pfVar1[1];
          fVar46 = pfVar1[2];
          fVar47 = pfVar1[3];
          auVar94._0_4_ = fVar44 * fVar24;
          auVar94._4_4_ = fVar45 * fVar25;
          auVar94._8_4_ = fVar46 * fVar26;
          auVar94._12_4_ = fVar47 * fVar27;
          auVar78 = vsubps_avx(auVar94,_local_928);
          auVar101._0_4_ = fVar44 * fVar32;
          auVar101._4_4_ = fVar45 * fVar33;
          auVar101._8_4_ = fVar46 * fVar34;
          auVar101._12_4_ = fVar47 * fVar35;
          auVar95._0_4_ = fVar40 * fVar28;
          auVar95._4_4_ = fVar41 * fVar29;
          auVar95._8_4_ = fVar42 * fVar30;
          auVar95._12_4_ = fVar43 * fVar31;
          auVar79 = vsubps_avx(auVar95,auVar101);
          fVar12 = auVar76._0_4_;
          fVar14 = auVar76._4_4_;
          fVar16 = auVar76._8_4_;
          fVar18 = auVar76._12_4_;
          local_8f8._4_4_ = fVar8 * fVar14;
          local_8f8._0_4_ = fVar8 * fVar12;
          fStack_8f0 = fVar8 * fVar16;
          fStack_8ec = fVar8 * fVar18;
          fVar13 = auVar66._0_4_;
          auVar96._0_4_ = fVar9 * fVar13;
          fVar15 = auVar66._4_4_;
          auVar96._4_4_ = fVar9 * fVar15;
          fVar17 = auVar66._8_4_;
          auVar96._8_4_ = fVar9 * fVar17;
          fVar19 = auVar66._12_4_;
          auVar96._12_4_ = fVar9 * fVar19;
          auVar66 = vsubps_avx(auVar96,_local_8f8);
          fVar86 = auVar75._0_4_;
          auVar97._0_4_ = fVar86 * fVar9;
          fVar91 = auVar75._4_4_;
          auVar97._4_4_ = fVar91 * fVar9;
          fVar92 = auVar75._8_4_;
          auVar97._8_4_ = fVar92 * fVar9;
          fVar93 = auVar75._12_4_;
          auVar97._12_4_ = fVar93 * fVar9;
          auVar69._0_4_ = fVar12 * fVar7;
          auVar69._4_4_ = fVar14 * fVar7;
          auVar69._8_4_ = fVar16 * fVar7;
          auVar69._12_4_ = fVar18 * fVar7;
          auVar75 = vsubps_avx(auVar69,auVar97);
          auVar98._0_4_ = fVar13 * fVar7;
          auVar98._4_4_ = fVar15 * fVar7;
          auVar98._8_4_ = fVar17 * fVar7;
          auVar98._12_4_ = fVar19 * fVar7;
          auVar89._0_4_ = fVar8 * fVar86;
          auVar89._4_4_ = fVar8 * fVar91;
          auVar89._8_4_ = fVar8 * fVar92;
          auVar89._12_4_ = fVar8 * fVar93;
          auVar76 = vsubps_avx(auVar89,auVar98);
          local_928._0_4_ = auVar78._0_4_;
          local_928._4_4_ = auVar78._4_4_;
          fStack_920 = auVar78._8_4_;
          fStack_91c = auVar78._12_4_;
          local_8d8 = auVar68._0_4_;
          fStack_8d4 = auVar68._4_4_;
          fStack_8d0 = auVar68._8_4_;
          fStack_8cc = auVar68._12_4_;
          auVar99._0_4_ = fVar7 * local_8d8 + fVar8 * (float)local_928._0_4_ + auVar79._0_4_ * fVar9
          ;
          auVar99._4_4_ =
               fVar7 * fStack_8d4 + fVar8 * (float)local_928._4_4_ + auVar79._4_4_ * fVar9;
          auVar99._8_4_ = fVar7 * fStack_8d0 + fVar8 * fStack_920 + auVar79._8_4_ * fVar9;
          auVar99._12_4_ = fVar7 * fStack_8cc + fVar8 * fStack_91c + auVar79._12_4_ * fVar9;
          local_8f8._0_4_ = auVar66._0_4_;
          local_8f8._4_4_ = auVar66._4_4_;
          fStack_8f0 = auVar66._8_4_;
          fStack_8ec = auVar66._12_4_;
          auVar70._8_4_ = 0x80000000;
          auVar70._0_8_ = 0x8000000080000000;
          auVar70._12_4_ = 0x80000000;
          auVar68 = vandps_avx(auVar99,auVar70);
          uVar49 = auVar68._0_4_;
          auVar90._0_4_ =
               (float)(uVar49 ^ (uint)((float)local_8f8._0_4_ * fVar40 +
                                      auVar76._0_4_ * fVar24 + auVar75._0_4_ * fVar32));
          uVar72 = auVar68._4_4_;
          auVar90._4_4_ =
               (float)(uVar72 ^ (uint)((float)local_8f8._4_4_ * fVar41 +
                                      auVar76._4_4_ * fVar25 + auVar75._4_4_ * fVar33));
          uVar73 = auVar68._8_4_;
          auVar90._8_4_ =
               (float)(uVar73 ^ (uint)(fStack_8f0 * fVar42 +
                                      auVar76._8_4_ * fVar26 + auVar75._8_4_ * fVar34));
          uVar74 = auVar68._12_4_;
          auVar90._12_4_ =
               (float)(uVar74 ^ (uint)(fStack_8ec * fVar43 +
                                      auVar76._12_4_ * fVar27 + auVar75._12_4_ * fVar35));
          auVar81._0_4_ =
               (float)(uVar49 ^ (uint)((float)local_8f8._0_4_ * fVar44 +
                                      auVar76._0_4_ * fVar36 + auVar75._0_4_ * fVar28));
          auVar81._4_4_ =
               (float)(uVar72 ^ (uint)((float)local_8f8._4_4_ * fVar45 +
                                      auVar76._4_4_ * fVar37 + auVar75._4_4_ * fVar29));
          auVar81._8_4_ =
               (float)(uVar73 ^ (uint)(fStack_8f0 * fVar46 +
                                      auVar76._8_4_ * fVar38 + auVar75._8_4_ * fVar30));
          auVar81._12_4_ =
               (float)(uVar74 ^ (uint)(fStack_8ec * fVar47 +
                                      auVar76._12_4_ * fVar39 + auVar75._12_4_ * fVar31));
          auVar66 = ZEXT816(0) << 0x20;
          auVar68 = vcmpps_avx(auVar90,auVar66,5);
          auVar75 = vcmpps_avx(auVar81,auVar66,5);
          auVar68 = vandps_avx(auVar68,auVar75);
          auVar75 = vcmpps_avx(auVar99,auVar66,4);
          auVar68 = vandps_avx(auVar68,auVar75);
          auVar84._0_4_ = auVar90._0_4_ + auVar81._0_4_;
          auVar84._4_4_ = auVar90._4_4_ + auVar81._4_4_;
          auVar84._8_4_ = auVar90._8_4_ + auVar81._8_4_;
          auVar84._12_4_ = auVar90._12_4_ + auVar81._12_4_;
          auVar82._8_4_ = 0x7fffffff;
          auVar82._0_8_ = 0x7fffffff7fffffff;
          auVar82._12_4_ = 0x7fffffff;
          auVar75 = vandps_avx(auVar99,auVar82);
          auVar66 = vcmpps_avx(auVar84,auVar75,2);
          auVar76 = auVar66 & auVar68;
          if ((((auVar76 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
               (auVar76 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar76 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < auVar76[0xf]) {
            uVar52 = 0;
            bVar10 = false;
          }
          else {
            auVar68 = vandps_avx(auVar68,auVar66);
            auVar71._0_4_ =
                 uVar49 ^ (uint)(local_8d8 * fVar86 +
                                (float)local_928._0_4_ * fVar13 + auVar79._0_4_ * fVar12);
            auVar71._4_4_ =
                 uVar72 ^ (uint)(fStack_8d4 * fVar91 +
                                (float)local_928._4_4_ * fVar15 + auVar79._4_4_ * fVar14);
            auVar71._8_4_ =
                 uVar73 ^ (uint)(fStack_8d0 * fVar92 + fStack_920 * fVar17 + auVar79._8_4_ * fVar16)
            ;
            auVar71._12_4_ =
                 uVar74 ^ (uint)(fStack_8cc * fVar93 + fStack_91c * fVar19 + auVar79._12_4_ * fVar18
                                );
            fVar12 = *(float *)(ray + k * 4 + 0x30);
            auVar85._0_4_ = auVar75._0_4_ * fVar12;
            auVar85._4_4_ = auVar75._4_4_ * fVar12;
            auVar85._8_4_ = auVar75._8_4_ * fVar12;
            auVar85._12_4_ = auVar75._12_4_ * fVar12;
            auVar66 = vcmpps_avx(auVar85,auVar71,1);
            fVar12 = *(float *)(ray + k * 4 + 0x80);
            auVar83._0_4_ = auVar75._0_4_ * fVar12;
            auVar83._4_4_ = auVar75._4_4_ * fVar12;
            auVar83._8_4_ = auVar75._8_4_ * fVar12;
            auVar83._12_4_ = auVar75._12_4_ * fVar12;
            auVar75 = vcmpps_avx(auVar71,auVar83,2);
            auVar75 = vandps_avx(auVar66,auVar75);
            auVar66 = auVar68 & auVar75;
            bVar22 = (auVar66 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
            bVar23 = (auVar66 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
            bVar21 = (auVar66 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
            bVar20 = auVar66[0xf] < '\0';
            bVar10 = ((bVar22 || bVar23) || bVar21) || bVar20;
            uVar52 = (undefined4)(uVar60 >> 0x20);
            if (((bVar22 || bVar23) || bVar21) || bVar20) {
              local_888 = vandps_avx(auVar75,auVar68);
            }
          }
          if (bVar10) {
            uVar50 = vmovmskps_avx(local_888);
            uVar51 = CONCAT44(uVar52,uVar50);
            do {
              uVar11 = 0;
              if (uVar51 != 0) {
                for (; (uVar51 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
                }
              }
              if ((*(uint *)(ray + k * 4 + 0x90) &
                  ((context->scene->geometries).items
                   [*(uint *)(lVar59 + uVar61 + 0x90 + uVar11 * 4)].ptr)->mask) != 0)
              goto LAB_00342081;
              uVar51 = uVar51 ^ 1L << (uVar11 & 0x3f);
            } while (uVar51 != 0);
          }
          uVar56 = uVar56 + 1;
          bVar62 = uVar56 < uVar60;
        } while (uVar56 != uVar60);
      }
LAB_00342081:
      uVar49 = 0;
      if (bVar62) {
        *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
        uVar49 = 1;
      }
    }
  } while ((uVar49 & 3) == 0);
  return puVar57 != &local_7d8;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }